

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
ProcessorGenerator::ProcessorGenerator
          (ProcessorGenerator *this,t_cpp_generator *generator,t_service *service,string *style)

{
  string *__lhs;
  string *__rhs;
  string *__lhs_00;
  t_service *ttype;
  bool bVar1;
  ofstream_with_content_based_conditional_update *poVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this->generator_ = generator;
  this->service_ = service;
  this->f_header_ = (ostream *)&generator->f_header_;
  poVar2 = &generator->f_service_tcc_;
  if (generator->gen_templates_ == false) {
    poVar2 = &generator->f_service_;
  }
  this->f_out_ = (ostream *)poVar2;
  __lhs = &this->service_name_;
  std::__cxx11::string::string
            ((string *)__lhs,
             (string *)&(generator->super_t_oop_generator).super_t_generator.service_name_);
  std::__cxx11::string::string((string *)&this->style_,(string *)style);
  (this->pstyle_)._M_dataplus._M_p = (pointer)&(this->pstyle_).field_2;
  (this->pstyle_)._M_string_length = 0;
  (this->pstyle_).field_2._M_local_buf[0] = '\0';
  (this->class_name_)._M_dataplus._M_p = (pointer)&(this->class_name_).field_2;
  (this->class_name_)._M_string_length = 0;
  (this->class_name_).field_2._M_local_buf[0] = '\0';
  (this->if_name_)._M_dataplus._M_p = (pointer)&(this->if_name_).field_2;
  (this->if_name_)._M_string_length = 0;
  (this->if_name_).field_2._M_local_buf[0] = '\0';
  (this->factory_class_name_)._M_dataplus._M_p = (pointer)&(this->factory_class_name_).field_2;
  (this->factory_class_name_)._M_string_length = 0;
  (this->factory_class_name_).field_2._M_local_buf[0] = '\0';
  (this->finish_cob_)._M_dataplus._M_p = (pointer)&(this->finish_cob_).field_2;
  (this->finish_cob_)._M_string_length = 0;
  (this->finish_cob_).field_2._M_local_buf[0] = '\0';
  (this->finish_cob_decl_)._M_dataplus._M_p = (pointer)&(this->finish_cob_decl_).field_2;
  (this->finish_cob_decl_)._M_string_length = 0;
  (this->finish_cob_decl_).field_2._M_local_buf[0] = '\0';
  (this->ret_type_)._M_dataplus._M_p = (pointer)&(this->ret_type_).field_2;
  (this->ret_type_)._M_string_length = 0;
  (this->ret_type_).field_2._M_local_buf[0] = '\0';
  (this->call_context_)._M_dataplus._M_p = (pointer)&(this->call_context_).field_2;
  (this->call_context_)._M_string_length = 0;
  (this->call_context_).field_2._M_local_buf[0] = '\0';
  (this->cob_arg_)._M_dataplus._M_p = (pointer)&(this->cob_arg_).field_2;
  (this->cob_arg_)._M_string_length = 0;
  (this->cob_arg_).field_2._M_local_buf[0] = '\0';
  (this->call_context_arg_)._M_dataplus._M_p = (pointer)&(this->call_context_arg_).field_2;
  (this->call_context_arg_)._M_string_length = 0;
  __rhs = &this->pstyle_;
  __lhs_00 = &this->class_name_;
  (this->call_context_arg_).field_2._M_local_buf[0] = '\0';
  (this->call_context_decl_)._M_dataplus._M_p = (pointer)&(this->call_context_decl_).field_2;
  (this->call_context_decl_)._M_string_length = 0;
  (this->call_context_decl_).field_2._M_local_buf[0] = '\0';
  (this->template_header_)._M_dataplus._M_p = (pointer)&(this->template_header_).field_2;
  (this->template_header_)._M_string_length = 0;
  (this->template_header_).field_2._M_local_buf[0] = '\0';
  (this->template_suffix_)._M_dataplus._M_p = (pointer)&(this->template_suffix_).field_2;
  (this->template_suffix_)._M_string_length = 0;
  (this->template_suffix_).field_2._M_local_buf[0] = '\0';
  (this->typename_str_)._M_dataplus._M_p = (pointer)&(this->typename_str_).field_2;
  (this->typename_str_)._M_string_length = 0;
  (this->typename_str_).field_2._M_local_buf[0] = '\0';
  (this->class_suffix_)._M_dataplus._M_p = (pointer)&(this->class_suffix_).field_2;
  (this->class_suffix_)._M_string_length = 0;
  psVar3 = &this->call_context_decl_;
  (this->class_suffix_).field_2._M_local_buf[0] = '\0';
  (this->extends_)._M_dataplus._M_p = (pointer)&(this->extends_).field_2;
  (this->extends_)._M_string_length = 0;
  (this->extends_).field_2._M_local_buf[0] = '\0';
  bVar1 = std::operator==(&this->style_,"Cob");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__rhs);
    std::operator+(&local_70,__lhs,__rhs);
    std::operator+(&local_90,&local_70,"Processor");
    std::__cxx11::string::operator=((string *)__lhs_00,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator+(&local_90,__lhs,"CobSvIf");
    std::__cxx11::string::operator=((string *)&this->if_name_,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::assign((char *)&this->finish_cob_);
    std::__cxx11::string::assign((char *)&this->finish_cob_decl_);
    std::__cxx11::string::assign((char *)&this->cob_arg_);
    psVar3 = &this->ret_type_;
  }
  else {
    std::operator+(&local_90,__lhs,"Processor");
    std::__cxx11::string::operator=((string *)__lhs_00,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator+(&local_90,__lhs,"If");
    std::__cxx11::string::operator=((string *)&this->if_name_,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::assign((char *)&this->ret_type_);
    std::__cxx11::string::assign((char *)&this->call_context_);
    std::__cxx11::string::assign((char *)&this->call_context_arg_);
  }
  std::__cxx11::string::assign((char *)psVar3);
  std::operator+(&local_90,__lhs_00,"Factory");
  std::__cxx11::string::operator=((string *)&this->factory_class_name_,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (generator->gen_templates_ == true) {
    std::__cxx11::string::assign((char *)&this->template_header_);
    std::__cxx11::string::assign((char *)&this->template_suffix_);
    std::__cxx11::string::assign((char *)&this->typename_str_);
    std::__cxx11::string::append((char *)__lhs_00);
    std::__cxx11::string::append((char *)&this->factory_class_name_);
  }
  ttype = this->service_->extends_;
  if (ttype != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_50,this,&ttype->super_t_type,false,false);
    std::operator+(&local_70,&local_50,__rhs);
    std::operator+(&local_90,&local_70,"Processor");
    std::__cxx11::string::operator=((string *)&this->extends_,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (this->generator_->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&this->extends_);
    }
  }
  return;
}

Assistant:

ProcessorGenerator::ProcessorGenerator(t_cpp_generator* generator,
                                       t_service* service,
                                       const string& style)
  : generator_(generator),
    service_(service),
    f_header_(generator->f_header_),
    f_out_(generator->gen_templates_ ? generator->f_service_tcc_ : generator->f_service_),
    service_name_(generator->service_name_),
    style_(style) {
  if (style_ == "Cob") {
    pstyle_ = "Async";
    class_name_ = service_name_ + pstyle_ + "Processor";
    if_name_ = service_name_ + "CobSvIf";

    finish_cob_ = "::std::function<void(bool ok)> cob, ";
    finish_cob_decl_ = "::std::function<void(bool ok)>, ";
    cob_arg_ = "cob, ";
    ret_type_ = "void ";
  } else {
    class_name_ = service_name_ + "Processor";
    if_name_ = service_name_ + "If";

    ret_type_ = "bool ";
    // TODO(edhall) callContext should eventually be added to TAsyncProcessor
    call_context_ = ", void* callContext";
    call_context_arg_ = ", callContext";
    call_context_decl_ = ", void*";
  }

  factory_class_name_ = class_name_ + "Factory";

  if (generator->gen_templates_) {
    template_header_ = "template <class Protocol_>\n";
    template_suffix_ = "<Protocol_>";
    typename_str_ = "typename ";
    class_name_ += "T";
    factory_class_name_ += "T";
  }

  if (service_->get_extends() != nullptr) {
    extends_ = type_name(service_->get_extends()) + pstyle_ + "Processor";
    if (generator_->gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends_ += "T<Protocol_>";
    }
  }
}